

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O2

void __thiscall re2c::CpgotoTable::CpgotoTable(CpgotoTable *this,Span *span,uint32_t nSpans)

{
  uint uVar1;
  State **ppSVar2;
  ulong uVar3;
  ulong uVar4;
  
  ppSVar2 = (State **)operator_new__(0x800);
  this->table = ppSVar2;
  uVar4 = 0;
  for (uVar3 = 0; uVar3 != nSpans; uVar3 = uVar3 + 1) {
    uVar1 = span[uVar3].ub;
    if (0xff < span[uVar3].ub) {
      uVar1 = 0x100;
    }
    for (uVar4 = uVar4 & 0xffffffff; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      this->table[uVar4] = span[uVar3].to;
    }
  }
  return;
}

Assistant:

CpgotoTable::CpgotoTable (const Span * span, uint32_t nSpans)
	: table (new const State * [TABLE_SIZE])
{
	uint32_t c = 0;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		for(; c < span[i].ub && c < TABLE_SIZE; ++c)
		{
			table[c] = span[i].to;
		}
	}
}